

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O2

void __thiscall
Assimp::Ogre::OgreXmlSerializer::ReadBones(OgreXmlSerializer *this,Skeleton *skeleton)

{
  string *__lhs;
  pointer ppBVar1;
  pointer ppBVar2;
  Bone *s;
  Skeleton *pSVar3;
  bool bVar4;
  uint16_t uVar5;
  int iVar6;
  Logger *pLVar7;
  string *__lhs_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ostream *poVar8;
  DeadlyImportError *pDVar9;
  long lVar10;
  float fVar11;
  aiVector3t<float> axis;
  Bone *bone;
  Bone *local_1f8;
  Skeleton *local_1f0;
  string local_1e8;
  float local_1c8;
  float local_1b8;
  string local_1a8 [11];
  
  local_1f0 = skeleton;
  pLVar7 = DefaultLogger::get();
  Logger::debug(pLVar7,"  - Bones");
  NextNode_abi_cxx11_(this);
  __lhs = &this->m_currentNodeName;
LAB_00442d81:
  bVar4 = std::operator==(__lhs,"bone");
  pSVar3 = local_1f0;
  if (!bVar4) {
    std::
    __sort<__gnu_cxx::__normal_iterator<Assimp::Ogre::Bone**,std::vector<Assimp::Ogre::Bone*,std::allocator<Assimp::Ogre::Bone*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Assimp::Ogre::Bone*,Assimp::Ogre::Bone*)>>
              ((__normal_iterator<Assimp::Ogre::Bone_**,_std::vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>_>
                )(local_1f0->bones).
                 super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>.
                 _M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<Assimp::Ogre::Bone_**,_std::vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>_>
                )(local_1f0->bones).
                 super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish,
               (_Iter_comp_iter<bool_(*)(Assimp::Ogre::Bone_*,_Assimp::Ogre::Bone_*)>)0x443cf9);
    ppBVar1 = (pSVar3->bones).
              super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    ppBVar2 = (pSVar3->bones).
              super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    lVar10 = 0;
    while( true ) {
      if ((long)ppBVar1 - (long)ppBVar2 >> 3 == lVar10) {
        return;
      }
      s = (local_1f0->bones).
          super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>._M_impl.
          super__Vector_impl_data._M_start[lVar10];
      pLVar7 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[5]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                 (char (*) [5])0x611064);
      poVar8 = (ostream *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                         local_1a8,&s->id);
      std::operator<<(poVar8," ");
      std::operator<<(poVar8,(string *)&s->name);
      std::__cxx11::stringbuf::str();
      Logger::debug(pLVar7,local_1e8._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      if ((unsigned_short)lVar10 != s->id) break;
      lVar10 = lVar10 + 1;
    }
    pDVar9 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::operator<<((ostream *)local_1a8,
                    "Bone ids are not in sequence starting from 0. Missing index ");
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__cxx11::stringbuf::str();
    DeadlyImportError::DeadlyImportError(pDVar9,&local_1e8);
    __cxa_throw(pDVar9,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_1f8 = (Bone *)operator_new(0xf8);
  Bone::Bone(local_1f8);
  bone = local_1f8;
  uVar5 = ReadAttribute<unsigned_short>(this,"id");
  bone->id = uVar5;
  ReadAttribute<std::__cxx11::string>(local_1a8,this,"name");
  std::__cxx11::string::operator=((string *)&bone->name,(string *)local_1a8);
  std::__cxx11::string::~string((string *)local_1a8);
LAB_00442e01:
  NextNode_abi_cxx11_(this);
  bVar4 = std::operator==(__lhs,"position");
  if (!bVar4) {
    bVar4 = std::operator==(__lhs,"rotation");
    if (!bVar4) {
      bVar4 = std::operator==(__lhs,"scale");
      if (!bVar4) goto LAB_00443034;
    }
  }
  bVar4 = std::operator==(__lhs,"position");
  if (bVar4) {
    fVar11 = ReadAttribute<float>(this,"x");
    (bone->position).x = fVar11;
    fVar11 = ReadAttribute<float>(this,"y");
    (bone->position).y = fVar11;
    fVar11 = ReadAttribute<float>(this,"z");
    (bone->position).z = fVar11;
  }
  else {
    bVar4 = std::operator==(__lhs,"rotation");
    if (bVar4) {
      fVar11 = ReadAttribute<float>(this,"angle");
      local_1f8 = (Bone *)CONCAT44(local_1f8._4_4_,fVar11);
      __lhs_00 = NextNode_abi_cxx11_(this);
      bVar4 = std::operator!=(__lhs_00,"axis");
      if (bVar4) {
        pDVar9 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::operator<<((ostream *)local_1a8,"No axis specified for bone rotation in bone ");
        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                  ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_1a8,
                   &bone->id);
        std::__cxx11::stringbuf::str();
        DeadlyImportError::DeadlyImportError(pDVar9,&local_1e8);
        __cxa_throw(pDVar9,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      local_1b8 = ReadAttribute<float>(this,"x");
      local_1c8 = ReadAttribute<float>(this,"y");
      fVar11 = ReadAttribute<float>(this,"z");
      axis.y = local_1c8;
      axis.x = local_1b8;
      axis.z = fVar11;
      aiQuaterniont<float>::aiQuaterniont((aiQuaterniont<float> *)local_1a8,axis,local_1f8._0_4_);
      *(pointer *)&bone->rotation = local_1a8[0]._M_dataplus._M_p;
      (bone->rotation).y = (float)(undefined4)local_1a8[0]._M_string_length;
      (bone->rotation).z = (float)local_1a8[0]._M_string_length._4_4_;
    }
    else {
      bVar4 = std::operator==(__lhs,"scale");
      if (bVar4) {
        iVar6 = (*this->m_reader->_vptr_IIrrXMLReader[7])(this->m_reader,"factor");
        if (CONCAT44(extraout_var,iVar6) == 0) {
          iVar6 = (*this->m_reader->_vptr_IIrrXMLReader[7])(this->m_reader,"x");
          if (CONCAT44(extraout_var_00,iVar6) != 0) {
            fVar11 = ReadAttribute<float>(this,"x");
            (bone->scale).x = fVar11;
          }
          iVar6 = (*this->m_reader->_vptr_IIrrXMLReader[7])(this->m_reader,"y");
          if (CONCAT44(extraout_var_01,iVar6) != 0) {
            fVar11 = ReadAttribute<float>(this,"y");
            (bone->scale).y = fVar11;
          }
          iVar6 = (*this->m_reader->_vptr_IIrrXMLReader[7])(this->m_reader,"z");
          if (CONCAT44(extraout_var_02,iVar6) != 0) {
            fVar11 = ReadAttribute<float>(this,"z");
            (bone->scale).z = fVar11;
          }
        }
        else {
          fVar11 = ReadAttribute<float>(this,"factor");
          (bone->scale).x = fVar11;
          (bone->scale).y = fVar11;
          (bone->scale).z = fVar11;
        }
      }
    }
  }
  goto LAB_00442e01;
LAB_00443034:
  std::vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>::push_back
            (&local_1f0->bones,&bone);
  goto LAB_00442d81;
}

Assistant:

void OgreXmlSerializer::ReadBones(Skeleton *skeleton)
{
    ASSIMP_LOG_DEBUG("  - Bones");

    NextNode();
    while(m_currentNodeName == nnBone)
    {
        Bone *bone = new Bone();
        bone->id = ReadAttribute<uint16_t>("id");
        bone->name = ReadAttribute<std::string>("name");

        NextNode();
        while(m_currentNodeName == nnPosition ||
              m_currentNodeName == nnRotation ||
              m_currentNodeName == nnScale)
        {
            if (m_currentNodeName == nnPosition)
            {
                bone->position.x = ReadAttribute<float>(anX);
                bone->position.y = ReadAttribute<float>(anY);
                bone->position.z = ReadAttribute<float>(anZ);
            }
            else if (m_currentNodeName == nnRotation)
            {
                float angle = ReadAttribute<float>("angle");

                if (NextNode() != nnAxis) {
                    throw DeadlyImportError(Formatter::format() << "No axis specified for bone rotation in bone " << bone->id);
                }

                aiVector3D axis;
                axis.x = ReadAttribute<float>(anX);
                axis.y = ReadAttribute<float>(anY);
                axis.z = ReadAttribute<float>(anZ);

                bone->rotation = aiQuaternion(axis, angle);
            }
            else if (m_currentNodeName == nnScale)
            {
                /// @todo Implement taking scale into account in matrix/pose calculations!
                if (HasAttribute("factor"))
                {
                    float factor = ReadAttribute<float>("factor");
                    bone->scale.Set(factor, factor, factor);
                }
                else
                {
                    if (HasAttribute(anX))
                        bone->scale.x = ReadAttribute<float>(anX);
                    if (HasAttribute(anY))
                        bone->scale.y = ReadAttribute<float>(anY);
                    if (HasAttribute(anZ))
                        bone->scale.z = ReadAttribute<float>(anZ);
                }
            }

            NextNode();
        }

        skeleton->bones.push_back(bone);
    }

    // Order bones by Id
    std::sort(skeleton->bones.begin(), skeleton->bones.end(), BoneCompare);

    // Validate that bone indexes are not skipped.
    /** @note Left this from original authors code, but not sure if this is strictly necessary
        as per the Ogre skeleton spec. It might be more that other (later) code in this imported does not break. */
    for (size_t i=0, len=skeleton->bones.size(); i<len; ++i)
    {
        Bone *b = skeleton->bones[i];
        ASSIMP_LOG_DEBUG_F( "    ", b->id, " ", b->name);

        if (b->id != static_cast<uint16_t>(i)) {
            throw DeadlyImportError(Formatter::format() << "Bone ids are not in sequence starting from 0. Missing index " << i);
        }
    }
}